

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.hpp
# Opt level: O2

uint64_t fibonacci(uint64_t n)

{
  uint64_t i;
  ulong uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  
  uVar2 = 1;
  uVar4 = 1;
  for (uVar1 = 3; uVar1 <= n; uVar1 = uVar1 + 1) {
    uVar3 = uVar2 + uVar4;
    uVar2 = uVar4;
    uVar4 = uVar3;
  }
  return uVar4;
}

Assistant:

uint64_t fibonacci(uint64_t n)
{
    uint64_t a = 1, b = 1;
    for (uint64_t i = 3; i <= n; ++i)
    {
        uint64_t c = a + b;
        a = b;
        b = c;
    }
    return b;
}